

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_nls.c
# Opt level: O3

int idaNlsLSolve(N_Vector delta,void *ida_mem)

{
  int iVar1;
  
  if (ida_mem == (void *)0x0) {
    iVar1 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0x113,"idaNlsLSolve",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/ida/ida_nls.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    iVar1 = (**(code **)((long)ida_mem + 0x400))
                      (ida_mem,delta,*(undefined8 *)((long)ida_mem + 0x180),
                       *(undefined8 *)((long)ida_mem + 0x188),*(undefined8 *)((long)ida_mem + 400),
                       *(undefined8 *)((long)ida_mem + 0x1c0));
    if (iVar1 < 0) {
      iVar1 = -7;
    }
    else {
      iVar1 = (uint)(iVar1 != 0) + (uint)(iVar1 != 0) * 2;
    }
  }
  return iVar1;
}

Assistant:

static int idaNlsLSolve(N_Vector delta, void* ida_mem)
{
  IDAMem IDA_mem;
  int retval;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  retval = IDA_mem->ida_lsolve(IDA_mem, delta, IDA_mem->ida_ewt, IDA_mem->ida_yy,
                               IDA_mem->ida_yp, IDA_mem->ida_savres);

  if (retval < 0) { return (IDA_LSOLVE_FAIL); }
  if (retval > 0) { return (IDA_LSOLVE_RECVR); }

  return (IDA_SUCCESS);
}